

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reuse_async_url_session.hpp
# Opt level: O3

void __thiscall m2d::savanna::ssl_reuse::interface::on_shutdown(interface *this,error_code ec)

{
  bool bVar1;
  error_category *peVar2;
  ulong uVar3;
  long lVar4;
  error_code local_40;
  error_code local_30;
  
  peVar2 = ec.cat_;
  uVar3 = ec._0_8_;
  boost::system::error_code::error_code<boost::asio::error::misc_errors>(&local_40,eof,(type *)0x0);
  if (local_40.val_ == ec.val_) {
    bVar1 = peVar2->id_ == (local_40.cat_)->id_;
    if ((local_40.cat_)->id_ == 0) {
      bVar1 = local_40.cat_ == peVar2;
    }
    if (!bVar1) goto LAB_0018aace;
  }
  else {
LAB_0018aace:
    boost::system::error_code::error_code<boost::asio::ssl::error::stream_errors>
              (&local_30,stream_truncated,(type *)0x0);
    if (local_30.val_ != ec.val_) goto LAB_0018ab20;
    bVar1 = peVar2->id_ == (local_30.cat_)->id_;
    if ((local_30.cat_)->id_ == 0) {
      bVar1 = local_30.cat_ == peVar2;
    }
    if (!bVar1) goto LAB_0018ab20;
  }
  boost::system::error_code::error_code(&local_40);
  uVar3 = CONCAT44(local_40._4_4_,local_40.val_);
  peVar2 = local_40.cat_;
LAB_0018ab20:
  lVar4 = 0x40;
  if ((uVar3 >> 0x20 & 1) == 0) {
    lVar4 = 0x28;
  }
  (**(code **)((long)this->_vptr_interface + lVar4))(this,uVar3,peVar2);
  return;
}

Assistant:

void on_shutdown(beast::error_code ec){
			if (ec == net::error::eof || ec == net::ssl::error::stream_truncated) {
				// Rationale:
				// http://stackoverflow.com/questions/25587403/boost-asio-ssl-async-shutdown-always-finishes-with-an-error
				ec = {};
			}
			if (ec) {
				error_callback(ec);
				return;
			}
			on_shutdown_l(ec);
		}